

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMDParameters.cpp
# Opt level: O1

void __thiscall OpenMD::RNEMD::RNEMDParameters::RNEMDParameters(RNEMDParameters *this)

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  ParamMap *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_240;
  size_type local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  ParameterBase *local_220;
  ParameterBase *local_218;
  string *local_210;
  ParameterBase *local_208;
  ParameterBase *local_200;
  string *local_1f8;
  ParameterBase *local_1f0;
  ParameterBase *local_1e8;
  ParameterBase *local_1e0;
  string *local_1d8;
  ParameterBase *local_1d0;
  string *local_1c8;
  ParameterBase *local_1c0;
  ParameterBase *local_1b8;
  ParameterBase *local_1b0;
  ParameterBase *local_1a8;
  ParameterBase *local_1a0;
  string *local_198;
  ParameterBase *local_190;
  string *local_188;
  ParameterBase *local_180;
  string *local_178;
  ParameterBase *local_170;
  string *local_168;
  ParameterBase *local_160;
  string *local_158;
  ParameterBase *local_150;
  ParameterBase *local_148;
  string *local_140;
  ParameterBase *local_138;
  ParameterBase *local_130;
  string *local_128;
  ParameterBase *local_120;
  string *local_118;
  ParameterBase *local_110;
  string *local_108;
  ParameterBase *local_100;
  string *local_f8;
  ParameterBase *local_f0;
  string *local_e8;
  ParameterBase *local_e0;
  ParameterBase *local_d8;
  ParameterBase *local_d0;
  ParameterBase *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  string *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  p_Var1 = &(this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__RNEMDParameters_0030dce8;
  local_38 = &(this->UseRNEMD).super_ParameterBase.keyword_.field_2;
  (this->UseRNEMD).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_38;
  (this->UseRNEMD).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UseRNEMD).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UseRNEMD).super_ParameterBase.optional_ = false;
  (this->UseRNEMD).super_ParameterBase.defaultValue_ = false;
  (this->UseRNEMD).super_ParameterBase.empty_ = true;
  (this->UseRNEMD).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_0030a410;
  (this->ObjectSelection).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003099d0;
  (this->ObjectSelection).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->ObjectSelection).super_ParameterBase.keyword_.field_2;
  (this->ObjectSelection).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ObjectSelection).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ObjectSelection).super_ParameterBase.optional_ = false;
  (this->ObjectSelection).super_ParameterBase.defaultValue_ = false;
  (this->ObjectSelection).super_ParameterBase.empty_ = true;
  (this->ObjectSelection).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_00309a40;
  (this->ObjectSelection).data_._M_dataplus._M_p = (pointer)&(this->ObjectSelection).data_.field_2;
  (this->ObjectSelection).data_._M_string_length = 0;
  (this->ObjectSelection).data_.field_2._M_local_buf[0] = '\0';
  (this->OutputSelection).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->OutputSelection).super_ParameterBase.keyword_.field_2;
  (this->OutputSelection).super_ParameterBase.keyword_._M_string_length = 0;
  (this->OutputSelection).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->OutputSelection).super_ParameterBase.optional_ = false;
  (this->OutputSelection).super_ParameterBase.defaultValue_ = false;
  (this->OutputSelection).super_ParameterBase.empty_ = true;
  (this->OutputSelection).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_00309a40;
  (this->OutputSelection).data_._M_dataplus._M_p = (pointer)&(this->OutputSelection).data_.field_2;
  (this->OutputSelection).data_._M_string_length = 0;
  (this->OutputSelection).data_.field_2._M_local_buf[0] = '\0';
  (this->Method).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003099d0;
  (this->Method).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->Method).super_ParameterBase.keyword_.field_2;
  (this->Method).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Method).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Method).super_ParameterBase.optional_ = false;
  (this->Method).super_ParameterBase.defaultValue_ = false;
  (this->Method).super_ParameterBase.empty_ = true;
  (this->Method).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__Parameter_00309a40;
  (this->Method).data_._M_dataplus._M_p = (pointer)&(this->Method).data_.field_2;
  (this->Method).data_._M_string_length = 0;
  (this->Method).data_.field_2._M_local_buf[0] = '\0';
  (this->FluxType).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003099d0;
  (this->FluxType).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->FluxType).super_ParameterBase.keyword_.field_2;
  (this->FluxType).super_ParameterBase.keyword_._M_string_length = 0;
  (this->FluxType).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->FluxType).super_ParameterBase.optional_ = false;
  (this->FluxType).super_ParameterBase.defaultValue_ = false;
  (this->FluxType).super_ParameterBase.empty_ = true;
  (this->FluxType).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__Parameter_00309a40;
  (this->FluxType).data_._M_dataplus._M_p = (pointer)&(this->FluxType).data_.field_2;
  (this->FluxType).data_._M_string_length = 0;
  (this->FluxType).data_.field_2._M_local_buf[0] = '\0';
  (this->ExchangeTime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003099d0;
  local_40 = &(this->ExchangeTime).super_ParameterBase.keyword_.field_2;
  (this->ExchangeTime).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_40;
  (this->ExchangeTime).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ExchangeTime).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ExchangeTime).super_ParameterBase.optional_ = false;
  (this->ExchangeTime).super_ParameterBase.defaultValue_ = false;
  (this->ExchangeTime).super_ParameterBase.empty_ = true;
  (this->ExchangeTime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_0030a488;
  (this->KineticFlux).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003099d0;
  local_48 = &(this->KineticFlux).super_ParameterBase.keyword_.field_2;
  (this->KineticFlux).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_48;
  (this->KineticFlux).super_ParameterBase.keyword_._M_string_length = 0;
  (this->KineticFlux).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->KineticFlux).super_ParameterBase.optional_ = false;
  (this->KineticFlux).super_ParameterBase.defaultValue_ = false;
  (this->KineticFlux).super_ParameterBase.empty_ = true;
  (this->KineticFlux).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_0030a488;
  (this->ParticleFlux).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003099d0;
  local_50 = &(this->ParticleFlux).super_ParameterBase.keyword_.field_2;
  (this->ParticleFlux).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_50;
  (this->ParticleFlux).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ParticleFlux).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ParticleFlux).super_ParameterBase.optional_ = false;
  (this->ParticleFlux).super_ParameterBase.defaultValue_ = false;
  (this->ParticleFlux).super_ParameterBase.empty_ = true;
  (this->ParticleFlux).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_0030a488;
  (this->CurrentDensity).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003099d0;
  local_58 = &(this->CurrentDensity).super_ParameterBase.keyword_.field_2;
  (this->CurrentDensity).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_58;
  (this->CurrentDensity).super_ParameterBase.keyword_._M_string_length = 0;
  (this->CurrentDensity).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->CurrentDensity).super_ParameterBase.optional_ = false;
  (this->CurrentDensity).super_ParameterBase.defaultValue_ = false;
  (this->CurrentDensity).super_ParameterBase.empty_ = true;
  (this->CurrentDensity).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_0030a488;
  (this->MomentumFlux).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003099d0;
  local_60 = &(this->MomentumFlux).super_ParameterBase.keyword_.field_2;
  (this->MomentumFlux).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_60;
  (this->MomentumFlux).super_ParameterBase.keyword_._M_string_length = 0;
  (this->MomentumFlux).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MomentumFlux).super_ParameterBase.optional_ = false;
  (this->MomentumFlux).super_ParameterBase.defaultValue_ = false;
  (this->MomentumFlux).super_ParameterBase.empty_ = true;
  (this->MomentumFlux).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_0030a488;
  (this->MomentumFluxVector).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003099d0;
  (this->MomentumFluxVector).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->MomentumFluxVector).super_ParameterBase.keyword_.field_2;
  (this->MomentumFluxVector).super_ParameterBase.keyword_._M_string_length = 0;
  (this->MomentumFluxVector).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MomentumFluxVector).super_ParameterBase.optional_ = false;
  (this->MomentumFluxVector).super_ParameterBase.defaultValue_ = false;
  (this->MomentumFluxVector).super_ParameterBase.empty_ = true;
  (this->MomentumFluxVector).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_0030b500;
  (this->MomentumFluxVector).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->MomentumFluxVector).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->MomentumFluxVector).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->AngularMomentumFlux).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003099d0;
  local_68 = &(this->AngularMomentumFlux).super_ParameterBase.keyword_.field_2;
  (this->AngularMomentumFlux).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_68;
  (this->AngularMomentumFlux).super_ParameterBase.keyword_._M_string_length = 0;
  (this->AngularMomentumFlux).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->AngularMomentumFlux).super_ParameterBase.optional_ = false;
  (this->AngularMomentumFlux).super_ParameterBase.defaultValue_ = false;
  (this->AngularMomentumFlux).super_ParameterBase.empty_ = true;
  (this->AngularMomentumFlux).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_0030a488;
  (this->AngularMomentumFluxVector).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003099d0;
  (this->AngularMomentumFluxVector).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->AngularMomentumFluxVector).super_ParameterBase.keyword_.field_2;
  (this->AngularMomentumFluxVector).super_ParameterBase.keyword_._M_string_length = 0;
  (this->AngularMomentumFluxVector).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->AngularMomentumFluxVector).super_ParameterBase.optional_ = false;
  (this->AngularMomentumFluxVector).super_ParameterBase.defaultValue_ = false;
  (this->AngularMomentumFluxVector).super_ParameterBase.empty_ = true;
  (this->AngularMomentumFluxVector).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_0030b500;
  (this->AngularMomentumFluxVector).data_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->AngularMomentumFluxVector).data_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->AngularMomentumFluxVector).data_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SlabWidth).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003099d0;
  local_70 = &(this->SlabWidth).super_ParameterBase.keyword_.field_2;
  (this->SlabWidth).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_70;
  (this->SlabWidth).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SlabWidth).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SlabWidth).super_ParameterBase.optional_ = false;
  (this->SlabWidth).super_ParameterBase.defaultValue_ = false;
  (this->SlabWidth).super_ParameterBase.empty_ = true;
  (this->SlabWidth).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_0030a488;
  (this->SlabACenter).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003099d0;
  local_78 = &(this->SlabACenter).super_ParameterBase.keyword_.field_2;
  (this->SlabACenter).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_78;
  (this->SlabACenter).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SlabACenter).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SlabACenter).super_ParameterBase.optional_ = false;
  (this->SlabACenter).super_ParameterBase.defaultValue_ = false;
  (this->SlabACenter).super_ParameterBase.empty_ = true;
  (this->SlabACenter).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_0030a488;
  (this->SlabBCenter).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003099d0;
  local_80 = &(this->SlabBCenter).super_ParameterBase.keyword_.field_2;
  (this->SlabBCenter).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_80;
  (this->SlabBCenter).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SlabBCenter).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SlabBCenter).super_ParameterBase.optional_ = false;
  (this->SlabBCenter).super_ParameterBase.defaultValue_ = false;
  (this->SlabBCenter).super_ParameterBase.empty_ = true;
  (this->SlabBCenter).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_0030a488;
  (this->SphereARadius).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003099d0;
  local_90 = &(this->SphereARadius).super_ParameterBase.keyword_.field_2;
  (this->SphereARadius).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_90;
  (this->SphereARadius).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SphereARadius).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SphereARadius).super_ParameterBase.optional_ = false;
  (this->SphereARadius).super_ParameterBase.defaultValue_ = false;
  (this->SphereARadius).super_ParameterBase.empty_ = true;
  (this->SphereARadius).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_0030a488;
  (this->SphereBRadius).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003099d0;
  local_98 = &(this->SphereBRadius).super_ParameterBase.keyword_.field_2;
  (this->SphereBRadius).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_98;
  (this->SphereBRadius).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SphereBRadius).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SphereBRadius).super_ParameterBase.optional_ = false;
  (this->SphereBRadius).super_ParameterBase.defaultValue_ = false;
  (this->SphereBRadius).super_ParameterBase.empty_ = true;
  (this->SphereBRadius).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_0030a488;
  (this->SelectionA).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003099d0;
  (this->SelectionA).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->SelectionA).super_ParameterBase.keyword_.field_2;
  (this->SelectionA).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SelectionA).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SelectionA).super_ParameterBase.optional_ = false;
  (this->SelectionA).super_ParameterBase.defaultValue_ = false;
  (this->SelectionA).super_ParameterBase.empty_ = true;
  (this->SelectionA).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_00309a40;
  (this->SelectionA).data_._M_dataplus._M_p = (pointer)&(this->SelectionA).data_.field_2;
  (this->SelectionA).data_._M_string_length = 0;
  (this->SelectionA).data_.field_2._M_local_buf[0] = '\0';
  (this->SelectionB).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003099d0;
  (this->SelectionB).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->SelectionB).super_ParameterBase.keyword_.field_2;
  (this->SelectionB).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SelectionB).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SelectionB).super_ParameterBase.optional_ = false;
  (this->SelectionB).super_ParameterBase.defaultValue_ = false;
  (this->SelectionB).super_ParameterBase.empty_ = true;
  (this->SelectionB).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_00309a40;
  (this->SelectionB).data_._M_dataplus._M_p = (pointer)&(this->SelectionB).data_.field_2;
  (this->SelectionB).data_._M_string_length = 0;
  (this->SelectionB).data_.field_2._M_local_buf[0] = '\0';
  (this->DividingArea).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003099d0;
  local_a0 = &(this->DividingArea).super_ParameterBase.keyword_.field_2;
  (this->DividingArea).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_a0;
  (this->DividingArea).super_ParameterBase.keyword_._M_string_length = 0;
  (this->DividingArea).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->DividingArea).super_ParameterBase.optional_ = false;
  (this->DividingArea).super_ParameterBase.defaultValue_ = false;
  (this->DividingArea).super_ParameterBase.empty_ = true;
  (this->DividingArea).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_0030a488;
  (this->CoordinateOrigin).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003099d0;
  (this->CoordinateOrigin).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->CoordinateOrigin).super_ParameterBase.keyword_.field_2;
  (this->CoordinateOrigin).super_ParameterBase.keyword_._M_string_length = 0;
  (this->CoordinateOrigin).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->CoordinateOrigin).super_ParameterBase.optional_ = false;
  (this->CoordinateOrigin).super_ParameterBase.defaultValue_ = false;
  (this->CoordinateOrigin).super_ParameterBase.empty_ = true;
  (this->CoordinateOrigin).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_0030b500;
  (this->CoordinateOrigin).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CoordinateOrigin).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CoordinateOrigin).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->OutputFileName).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003099d0;
  (this->OutputFileName).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->OutputFileName).super_ParameterBase.keyword_.field_2;
  (this->OutputFileName).super_ParameterBase.keyword_._M_string_length = 0;
  (this->OutputFileName).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->OutputFileName).super_ParameterBase.optional_ = false;
  (this->OutputFileName).super_ParameterBase.defaultValue_ = false;
  (this->OutputFileName).super_ParameterBase.empty_ = true;
  (this->OutputFileName).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_00309a40;
  (this->OutputFileName).data_._M_dataplus._M_p = (pointer)&(this->OutputFileName).data_.field_2;
  (this->OutputFileName).data_._M_string_length = 0;
  (this->OutputFileName).data_.field_2._M_local_buf[0] = '\0';
  (this->OutputBins).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003099d0;
  local_a8 = &(this->OutputBins).super_ParameterBase.keyword_.field_2;
  (this->OutputBins).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_a8;
  (this->OutputBins).super_ParameterBase.keyword_._M_string_length = 0;
  (this->OutputBins).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->OutputBins).super_ParameterBase.optional_ = false;
  (this->OutputBins).super_ParameterBase.defaultValue_ = false;
  (this->OutputBins).super_ParameterBase.empty_ = true;
  (this->OutputBins).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_0030a500;
  (this->OutputBinWidth).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003099d0;
  local_b0 = &(this->OutputBinWidth).super_ParameterBase.keyword_.field_2;
  (this->OutputBinWidth).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_b0;
  (this->OutputBinWidth).super_ParameterBase.keyword_._M_string_length = 0;
  (this->OutputBinWidth).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->OutputBinWidth).super_ParameterBase.optional_ = false;
  (this->OutputBinWidth).super_ParameterBase.defaultValue_ = false;
  (this->OutputBinWidth).super_ParameterBase.empty_ = true;
  (this->OutputBinWidth).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_0030a488;
  (this->OutputFields).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003099d0;
  (this->OutputFields).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->OutputFields).super_ParameterBase.keyword_.field_2;
  (this->OutputFields).super_ParameterBase.keyword_._M_string_length = 0;
  (this->OutputFields).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->OutputFields).super_ParameterBase.optional_ = false;
  (this->OutputFields).super_ParameterBase.defaultValue_ = false;
  (this->OutputFields).super_ParameterBase.empty_ = true;
  (this->OutputFields).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_00309a40;
  (this->OutputFields).data_._M_dataplus._M_p = (pointer)&(this->OutputFields).data_.field_2;
  (this->OutputFields).data_._M_string_length = 0;
  (this->OutputFields).data_.field_2._M_local_buf[0] = '\0';
  (this->PrivilegedAxis).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003099d0;
  (this->PrivilegedAxis).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->PrivilegedAxis).super_ParameterBase.keyword_.field_2;
  (this->PrivilegedAxis).super_ParameterBase.keyword_._M_string_length = 0;
  (this->PrivilegedAxis).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->PrivilegedAxis).super_ParameterBase.optional_ = false;
  (this->PrivilegedAxis).super_ParameterBase.defaultValue_ = false;
  (this->PrivilegedAxis).super_ParameterBase.empty_ = true;
  (this->PrivilegedAxis).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_00309a40;
  (this->PrivilegedAxis).data_._M_dataplus._M_p = (pointer)&(this->PrivilegedAxis).data_.field_2;
  (this->PrivilegedAxis).data_._M_string_length = 0;
  (this->PrivilegedAxis).data_.field_2._M_local_buf[0] = '\0';
  (this->SPFScalingPower).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003099d0;
  local_b8 = &(this->SPFScalingPower).super_ParameterBase.keyword_.field_2;
  (this->SPFScalingPower).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_b8;
  (this->SPFScalingPower).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SPFScalingPower).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SPFScalingPower).super_ParameterBase.optional_ = false;
  (this->SPFScalingPower).super_ParameterBase.defaultValue_ = false;
  (this->SPFScalingPower).super_ParameterBase.empty_ = true;
  (this->SPFScalingPower).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_0030a500;
  (this->SPFUniformKineticScaling).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003099d0;
  local_c0 = &(this->SPFUniformKineticScaling).super_ParameterBase.keyword_.field_2;
  (this->SPFUniformKineticScaling).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_c0
  ;
  (this->SPFUniformKineticScaling).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SPFUniformKineticScaling).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SPFUniformKineticScaling).super_ParameterBase.optional_ = false;
  (this->SPFUniformKineticScaling).super_ParameterBase.defaultValue_ = false;
  (this->SPFUniformKineticScaling).super_ParameterBase.empty_ = true;
  (this->SPFUniformKineticScaling).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_0030a410;
  this->calculateElectricField_ = false;
  paVar3 = &local_268.first.field_2;
  local_c8 = &(this->UseRNEMD).super_ParameterBase;
  psVar2 = &(this->UseRNEMD).super_ParameterBase.keyword_;
  local_d0 = &(this->ObjectSelection).super_ParameterBase;
  local_1e8 = &(this->OutputSelection).super_ParameterBase;
  local_d8 = &(this->Method).super_ParameterBase;
  local_e0 = &(this->FluxType).super_ParameterBase;
  local_f0 = &(this->ExchangeTime).super_ParameterBase;
  local_e8 = (string *)&(this->ExchangeTime).super_ParameterBase.keyword_;
  local_100 = &(this->KineticFlux).super_ParameterBase;
  local_f8 = (string *)&(this->KineticFlux).super_ParameterBase.keyword_;
  local_110 = &(this->ParticleFlux).super_ParameterBase;
  local_108 = (string *)&(this->ParticleFlux).super_ParameterBase.keyword_;
  local_120 = &(this->CurrentDensity).super_ParameterBase;
  local_118 = (string *)&(this->CurrentDensity).super_ParameterBase.keyword_;
  local_130 = &(this->MomentumFlux).super_ParameterBase;
  local_128 = (string *)&(this->MomentumFlux).super_ParameterBase.keyword_;
  local_138 = &(this->MomentumFluxVector).super_ParameterBase;
  local_148 = &(this->AngularMomentumFlux).super_ParameterBase;
  local_140 = (string *)&(this->AngularMomentumFlux).super_ParameterBase.keyword_;
  local_150 = &(this->AngularMomentumFluxVector).super_ParameterBase;
  local_160 = &(this->SlabWidth).super_ParameterBase;
  local_158 = (string *)&(this->SlabWidth).super_ParameterBase.keyword_;
  local_170 = &(this->SlabACenter).super_ParameterBase;
  local_168 = (string *)&(this->SlabACenter).super_ParameterBase.keyword_;
  local_180 = &(this->SlabBCenter).super_ParameterBase;
  local_178 = (string *)&(this->SlabBCenter).super_ParameterBase.keyword_;
  local_190 = &(this->SphereARadius).super_ParameterBase;
  local_188 = (string *)&(this->SphereARadius).super_ParameterBase.keyword_;
  local_1a0 = &(this->SphereBRadius).super_ParameterBase;
  local_198 = (string *)&(this->SphereBRadius).super_ParameterBase.keyword_;
  local_1a8 = &(this->SelectionA).super_ParameterBase;
  local_1b0 = &(this->SelectionB).super_ParameterBase;
  local_200 = &(this->DividingArea).super_ParameterBase;
  local_1f8 = (string *)&(this->DividingArea).super_ParameterBase.keyword_;
  local_1b8 = &(this->CoordinateOrigin).super_ParameterBase;
  local_1c0 = &(this->OutputFileName).super_ParameterBase;
  local_1d0 = &(this->OutputBins).super_ParameterBase;
  local_1c8 = (string *)&(this->OutputBins).super_ParameterBase.keyword_;
  local_1e0 = &(this->OutputBinWidth).super_ParameterBase;
  local_1d8 = (string *)&(this->OutputBinWidth).super_ParameterBase.keyword_;
  local_1f0 = &(this->OutputFields).super_ParameterBase;
  local_208 = &(this->PrivilegedAxis).super_ParameterBase;
  local_218 = &(this->SPFScalingPower).super_ParameterBase;
  local_210 = (string *)&(this->SPFScalingPower).super_ParameterBase.keyword_;
  local_220 = &(this->SPFUniformKineticScaling).super_ParameterBase;
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  local_88 = psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"useRNEMD","");
  std::__cxx11::string::_M_assign((string *)psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->UseRNEMD).super_ParameterBase.optional_ = true;
  (this->UseRNEMD).super_ParameterBase.defaultValue_ = true;
  (this->UseRNEMD).super_ParameterBase.empty_ = false;
  (this->UseRNEMD).super_ParameterBase.field_0x2b = 0;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"useRNEMD","");
  this_00 = &(this->super_DataHolder).parameters_;
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_c8;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"objectSelection","");
  std::__cxx11::string::_M_assign((string *)&(this->ObjectSelection).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->ObjectSelection).super_ParameterBase.optional_ = true;
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"select all","");
  std::__cxx11::string::_M_assign((string *)&(this->ObjectSelection).data_);
  (this->ObjectSelection).super_ParameterBase.defaultValue_ = true;
  (this->ObjectSelection).super_ParameterBase.empty_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"objectSelection","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_d0;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"method","");
  std::__cxx11::string::_M_assign((string *)&(this->Method).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->Method).super_ParameterBase.optional_ = true;
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"VSS","");
  std::__cxx11::string::_M_assign((string *)&(this->Method).data_);
  (this->Method).super_ParameterBase.defaultValue_ = true;
  (this->Method).super_ParameterBase.empty_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"method","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_d8;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"fluxType","");
  std::__cxx11::string::_M_assign((string *)&(this->FluxType).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->FluxType).super_ParameterBase.optional_ = true;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"fluxType","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_e0;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"exchangeTime","");
  std::__cxx11::string::_M_assign(local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->ExchangeTime).super_ParameterBase.optional_ = true;
  (this->ExchangeTime).super_ParameterBase.defaultValue_ = true;
  (this->ExchangeTime).data_ = 100.0;
  (this->ExchangeTime).super_ParameterBase.empty_ = false;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"exchangeTime","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_f0;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"kineticFlux","");
  std::__cxx11::string::_M_assign(local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->KineticFlux).super_ParameterBase.optional_ = true;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"kineticFlux","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_100;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"particleFlux","");
  std::__cxx11::string::_M_assign(local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->ParticleFlux).super_ParameterBase.optional_ = true;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"particleFlux","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_110;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"currentDensity","");
  std::__cxx11::string::_M_assign(local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->CurrentDensity).super_ParameterBase.optional_ = true;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"currentDensity","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_120;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"momentumFlux","");
  std::__cxx11::string::_M_assign(local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->MomentumFlux).super_ParameterBase.optional_ = true;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"momentumFlux","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_130;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"momentumFluxVector","");
  std::__cxx11::string::_M_assign
            ((string *)&(this->MomentumFluxVector).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->MomentumFluxVector).super_ParameterBase.optional_ = true;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"momentumFluxVector","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_138;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"angularMomentumFlux","");
  std::__cxx11::string::_M_assign(local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->AngularMomentumFlux).super_ParameterBase.optional_ = true;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"angularMomentumFlux","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_148;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"angularMomentumFluxVector","");
  std::__cxx11::string::_M_assign
            ((string *)&(this->AngularMomentumFluxVector).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->AngularMomentumFluxVector).super_ParameterBase.optional_ = true;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_240,"angularMomentumFluxVector","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_150;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"slabWidth","");
  std::__cxx11::string::_M_assign(local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->SlabWidth).super_ParameterBase.optional_ = true;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"slabWidth","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_160;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"slabAcenter","");
  std::__cxx11::string::_M_assign(local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->SlabACenter).super_ParameterBase.optional_ = true;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"slabAcenter","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_170;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"slabBcenter","");
  std::__cxx11::string::_M_assign(local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->SlabBCenter).super_ParameterBase.optional_ = true;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"slabBcenter","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_180;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"sphereAradius","");
  std::__cxx11::string::_M_assign(local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->SphereARadius).super_ParameterBase.optional_ = true;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"sphereAradius","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_190;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"sphereBradius","");
  std::__cxx11::string::_M_assign(local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->SphereBRadius).super_ParameterBase.optional_ = true;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"sphereBradius","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_1a0;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"selectionA","");
  std::__cxx11::string::_M_assign((string *)&(this->SelectionA).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->SelectionA).super_ParameterBase.optional_ = true;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"selectionA","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_1a8;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"selectionB","");
  std::__cxx11::string::_M_assign((string *)&(this->SelectionB).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->SelectionB).super_ParameterBase.optional_ = true;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"selectionB","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_1b0;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"coordinateOrigin","");
  std::__cxx11::string::_M_assign((string *)&(this->CoordinateOrigin).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->CoordinateOrigin).super_ParameterBase.optional_ = true;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"coordinateOrigin","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_1b8;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"outputFileName","");
  std::__cxx11::string::_M_assign((string *)&(this->OutputFileName).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->OutputFileName).super_ParameterBase.optional_ = true;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"outputFileName","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_1c0;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"outputBins","");
  std::__cxx11::string::_M_assign(local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->OutputBins).super_ParameterBase.optional_ = true;
  (this->OutputBins).super_ParameterBase.defaultValue_ = true;
  *(undefined4 *)&(this->OutputBins).super_ParameterBase.field_0x2c = 0x14;
  (this->OutputBins).super_ParameterBase.empty_ = false;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"outputBins","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_1d0;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"outputBinWidth","");
  std::__cxx11::string::_M_assign(local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->OutputBinWidth).super_ParameterBase.optional_ = true;
  (this->OutputBinWidth).super_ParameterBase.defaultValue_ = true;
  (this->OutputBinWidth).data_ = 2.0;
  (this->OutputBinWidth).super_ParameterBase.empty_ = false;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"outputBinWidth","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_1e0;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"outputSelection","");
  std::__cxx11::string::_M_assign((string *)&(this->OutputSelection).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->OutputSelection).super_ParameterBase.optional_ = true;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"outputSelection","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_1e8;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"outputFields","");
  std::__cxx11::string::_M_assign((string *)&(this->OutputFields).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->OutputFields).super_ParameterBase.optional_ = true;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"outputFields","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_1f0;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"dividingArea","");
  std::__cxx11::string::_M_assign(local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->DividingArea).super_ParameterBase.optional_ = true;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"dividingArea","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_200;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"privilegedAxis","");
  std::__cxx11::string::_M_assign((string *)&(this->PrivilegedAxis).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->PrivilegedAxis).super_ParameterBase.optional_ = true;
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"z","");
  std::__cxx11::string::_M_assign((string *)&(this->PrivilegedAxis).data_);
  (this->PrivilegedAxis).super_ParameterBase.defaultValue_ = true;
  (this->PrivilegedAxis).super_ParameterBase.empty_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"privilegedAxis","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_208;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"spfScalingPower","");
  std::__cxx11::string::_M_assign(local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->SPFScalingPower).super_ParameterBase.optional_ = true;
  (this->SPFScalingPower).super_ParameterBase.defaultValue_ = true;
  *(undefined4 *)&(this->SPFScalingPower).super_ParameterBase.field_0x2c = 3;
  (this->SPFScalingPower).super_ParameterBase.empty_ = false;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"spfScalingPower","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_218;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  local_268.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"spfUniformKineticScaling","");
  std::__cxx11::string::_M_assign
            ((string *)&(this->SPFUniformKineticScaling).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  (this->SPFUniformKineticScaling).super_ParameterBase.optional_ = true;
  (this->SPFUniformKineticScaling).super_ParameterBase.defaultValue_ = true;
  (this->SPFUniformKineticScaling).super_ParameterBase.empty_ = false;
  (this->SPFUniformKineticScaling).super_ParameterBase.field_0x2b = 0;
  local_240 = &local_230;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_240,"spfUniformKineticScaling","");
  if (local_240 == &local_230) {
    local_268.first.field_2._8_8_ = local_230._8_8_;
    local_268.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_268.first._M_dataplus._M_p = (pointer)local_240;
  }
  local_268.first.field_2._M_allocated_capacity._1_7_ = local_230._M_allocated_capacity._1_7_;
  local_268.first.field_2._M_local_buf[0] = local_230._M_local_buf[0];
  local_268.first._M_string_length = local_238;
  local_238 = 0;
  local_230._M_local_buf[0] = '\0';
  local_268.second = local_220;
  local_240 = &local_230;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_268.first._M_dataplus._M_p,
                    local_268.first.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,
                    CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

RNEMDParameters::RNEMDParameters() {
    DefineOptionalParameterWithDefaultValue(UseRNEMD, "useRNEMD", false);
    DefineOptionalParameterWithDefaultValue(ObjectSelection, "objectSelection",
                                            "select all");

    DefineOptionalParameterWithDefaultValue(Method, "method", "VSS");
    DefineOptionalParameter(FluxType, "fluxType");

    DefineOptionalParameterWithDefaultValue(ExchangeTime, "exchangeTime",
                                            100.0);
    DefineOptionalParameter(KineticFlux, "kineticFlux");
    DefineOptionalParameter(ParticleFlux, "particleFlux");
    DefineOptionalParameter(CurrentDensity, "currentDensity");
    DefineOptionalParameter(MomentumFlux, "momentumFlux");
    DefineOptionalParameter(MomentumFluxVector, "momentumFluxVector");
    DefineOptionalParameter(AngularMomentumFlux, "angularMomentumFlux");
    DefineOptionalParameter(AngularMomentumFluxVector,
                            "angularMomentumFluxVector");
    DefineOptionalParameter(SlabWidth, "slabWidth");
    DefineOptionalParameter(SlabACenter, "slabAcenter");
    DefineOptionalParameter(SlabBCenter, "slabBcenter");
    DefineOptionalParameter(SphereARadius, "sphereAradius");
    DefineOptionalParameter(SphereBRadius, "sphereBradius");
    DefineOptionalParameter(SelectionA, "selectionA");
    DefineOptionalParameter(SelectionB, "selectionB");
    DefineOptionalParameter(CoordinateOrigin, "coordinateOrigin");
    DefineOptionalParameter(OutputFileName, "outputFileName");
    DefineOptionalParameterWithDefaultValue(OutputBins, "outputBins", 20);
    DefineOptionalParameterWithDefaultValue(OutputBinWidth, "outputBinWidth",
                                            2.0);
    DefineOptionalParameter(OutputSelection, "outputSelection");
    DefineOptionalParameter(OutputFields, "outputFields");
    DefineOptionalParameter(DividingArea, "dividingArea");
    DefineOptionalParameterWithDefaultValue(PrivilegedAxis, "privilegedAxis",
                                            "z");
    DefineOptionalParameterWithDefaultValue(SPFScalingPower, "spfScalingPower",
                                            3);
    DefineOptionalParameterWithDefaultValue(SPFUniformKineticScaling,
                                            "spfUniformKineticScaling", false);
  }